

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O3

void expfilter(double *sig,int N,double alpha,double *oup)

{
  ulong uVar1;
  double dVar2;
  
  *oup = *sig;
  if (1 < N) {
    dVar2 = *oup;
    uVar1 = 1;
    do {
      dVar2 = dVar2 * (1.0 - alpha) + sig[uVar1] * alpha;
      oup[uVar1] = dVar2;
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

void expfilter(double *sig,int N, double alpha,double *oup) {
	int i;
	double beta;
	
	/* alpha accepts values between 0 and 1.
	 * No error check is implemented presently
	 * so make sure that the correct value of 
	 * alpha is entered.  
	 */ 
	beta = 1.0 - alpha;
	
	oup[0] = sig[0];
	
	for (i = 1; i < N; ++i) {
		oup[i] = alpha * sig[i] + beta * oup[i-1];
	}
}